

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SetAssetIssuanceTest1_Test::TestBody
          (ConfidentialTransactionContext_SetAssetIssuanceTest1_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  undefined8 local_d50 [2];
  Amount local_d40 [16];
  IssuanceParameter local_d30;
  ByteData256 contract_hash;
  Txid txid;
  IssuanceParameter param;
  IssuanceOutputParameter issue_output;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  IssuanceOutputParameter token_output;
  Address token_address;
  Address asset_address;
  
  std::__cxx11::string::string
            ((string *)&issue_output,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)&token_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&tx_base,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,(allocator *)&token_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&expect_tx,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&tx_base);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",
             (allocator *)&token_output);
  cfd::core::Txid::Txid(&txid,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  local_d40._0_8_ = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_d40[8] = (Amount)extraout_DL;
  local_d50[0] = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_d50[1]._0_1_ = extraout_DL_00;
  std::__cxx11::string::string
            ((string *)&issue_output,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",
             (allocator *)&token_address);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&asset_address,(string *)&issue_output,(vector *)&token_output);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &token_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,"2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG",(allocator *)&param);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&token_address,(string *)&issue_output,(vector *)&token_output);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &token_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&issue_output);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&token_output);
  cfd::core::Address::operator=(&issue_output.address,&asset_address);
  issue_output._872_1_ = local_d40[8];
  issue_output.amount = local_d40[0];
  issue_output._865_1_ = local_d40[1];
  issue_output._866_1_ = local_d40[2];
  issue_output._867_1_ = local_d40[3];
  issue_output._868_1_ = local_d40[4];
  issue_output._869_1_ = local_d40[5];
  issue_output._870_1_ = local_d40[6];
  issue_output._871_1_ = local_d40[7];
  cfd::core::Address::operator=(&token_output.address,&token_address);
  token_output._872_1_ = (undefined1)local_d50[1];
  token_output.amount = (Amount)(undefined1)local_d50[0];
  token_output._865_7_ = local_d50[0]._1_7_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar_1,&txid,1);
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                ((OutPoint *)&local_d30,(Amount *)&tx,(IssuanceOutputParameter *)&gtest_ar_1,
                 local_d40,&issue_output,SUB81(local_d50,0),(ByteData256 *)&token_output);
      cfd::core::IssuanceParameter::operator=(&param,&local_d30);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_d30);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_d30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xaa,
               "Expected: (param = tx.SetAssetIssuance(OutPoint(txid, 1), asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d30);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  lhs = local_d30.entropy._vptr_BlindFactor;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",(char *)lhs,
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&local_d30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",
             (char *)local_d30.entropy._vptr_BlindFactor,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_d30);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_d30);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&token_output);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issue_output);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::Address::~Address(&token_address);
  cfd::core::Address::~Address(&asset_address);
  cfd::core::Txid::~Txid(&txid);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&expect_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetIssuanceTest1)
{
    ConfidentialTransactionContext tx_base(
        "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
    ConfidentialTransactionContext expect_tx(
        "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f");
    Amount asset_amount = Amount::CreateByCoinAmount(100.0);
    Amount token_amount = Amount::CreateByCoinAmount(10.0);
    Address asset_address("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z", cfd::core::GetElementsAddressFormatList());
    Address token_address("2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG", cfd::core::GetElementsAddressFormatList());
    ByteData256 contract_hash;
    bool is_blind = false;
    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    IssuanceOutputParameter token_output;
    issue_output.address = asset_address;
    issue_output.amount = asset_amount;
    token_output.address = token_address;
    token_output.amount = token_amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetIssuance(OutPoint(txid, 1), asset_amount,
                                     issue_output, token_amount,
                                     token_output, is_blind,
                                     contract_hash)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
    EXPECT_STREQ(
        param.entropy.GetHex().c_str(),
        "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
}